

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow *window,ImU32 col)

{
  ImVector<ImGuiWindow_*> *this;
  ImDrawList *pIVar1;
  ImGuiWindow *pIVar2;
  ImVec2 cr_min;
  ImVec2 cr_max;
  int i;
  ImDrawCmd *pIVar3;
  ImGuiWindow **ppIVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar8;
  float fVar9;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  ImRect viewport_rect;
  ImDrawCmd cmd;
  ImRect local_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  ImDrawCmd local_78;
  ImRect local_40;
  
  if (0xffffff < col) {
    local_a8 = ImGuiViewportP::GetMainRect(window->Viewport);
    pIVar1 = window->RootWindowDockTree->DrawList;
    fVar6 = local_a8.Min.x;
    fVar7 = local_a8.Min.y;
    fVar8 = local_a8.Max.x;
    fVar9 = local_a8.Max.y;
    if ((pIVar1->CmdBuffer).Size == 0) {
      local_88._8_4_ = extraout_XMM0_Dc;
      local_88._0_4_ = local_a8.Min.x;
      local_88._4_4_ = local_a8.Min.y;
      local_88._12_4_ = extraout_XMM0_Dd;
      local_98._8_4_ = in_XMM1_Dc;
      local_98._0_4_ = local_a8.Max.x;
      local_98._4_4_ = local_a8.Max.y;
      local_98._12_4_ = in_XMM1_Dd;
      ImDrawList::AddDrawCmd(pIVar1);
      fVar6 = (float)local_88._0_4_;
      fVar7 = (float)local_88._4_4_;
      fVar8 = (float)local_98._0_4_;
      fVar9 = (float)local_98._4_4_;
    }
    cr_min.y = fVar7 + -1.0;
    cr_min.x = fVar6 + -1.0;
    cr_max.y = fVar9 + 1.0;
    cr_max.x = fVar8 + 1.0;
    ImDrawList::PushClipRect(pIVar1,cr_min,cr_max,false);
    ImDrawList::AddRectFilled(pIVar1,&local_a8.Min,&local_a8.Max,col,0.0,0);
    pIVar3 = ImVector<ImDrawCmd>::back(&pIVar1->CmdBuffer);
    local_78.ClipRect = pIVar3->ClipRect;
    local_78.TextureId = pIVar3->TextureId;
    local_78.VtxOffset = pIVar3->VtxOffset;
    local_78.IdxOffset = pIVar3->IdxOffset;
    local_78.ElemCount = pIVar3->ElemCount;
    local_78._36_4_ = *(undefined4 *)&pIVar3->field_0x24;
    local_78.UserCallback = pIVar3->UserCallback;
    local_78.UserCallbackData = pIVar3->UserCallbackData;
    if (local_78.ElemCount != 6) {
      __assert_fail("cmd.ElemCount == 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x1350,"void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow *, ImU32)");
    }
    ImVector<ImDrawCmd>::pop_back(&pIVar1->CmdBuffer);
    ImVector<ImDrawCmd>::push_front(&pIVar1->CmdBuffer,&local_78);
    ImDrawList::PopClipRect(pIVar1);
    ImDrawList::AddDrawCmd(pIVar1);
    if ((window->RootWindow->field_0x3f9 & 1) != 0) {
      ppIVar4 = &window->RootWindowDockTree;
      do {
        pIVar2 = *ppIVar4;
        this = &(pIVar2->DC).ChildWindows;
        i = (pIVar2->DC).ChildWindows.Size;
        do {
          iVar5 = i;
          if (iVar5 < 1) {
            pIVar1 = pIVar2->DrawList;
            if ((pIVar1->CmdBuffer).Size == 0) {
              ImDrawList::AddDrawCmd(pIVar1);
            }
            ImDrawList::PushClipRect(pIVar1,local_a8.Min,local_a8.Max,false);
            local_78.ClipRect = (ImVec4)ImGuiWindow::Rect(window->RootWindowDockTree);
            local_40 = ImGuiWindow::Rect(window->RootWindow);
            RenderRectFilledWithHole(pIVar1,(ImRect *)&local_78,&local_40,col,0.0);
            ImDrawList::PopClipRect(pIVar1);
            return;
          }
          i = iVar5 + -1;
          ppIVar4 = ImVector<ImGuiWindow_*>::operator[](this,i);
        } while (((*ppIVar4)->Active != true) || ((*ppIVar4)->Hidden == true));
        ppIVar4 = ImVector<ImGuiWindow_*>::operator[](this,iVar5 + -1);
      } while( true );
    }
  }
  return;
}

Assistant:

static void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow* window, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    ImGuiViewportP* viewport = window->Viewport;
    ImRect viewport_rect = viewport->GetMainRect();

    // Draw behind window by moving the draw command at the FRONT of the draw list
    {
        // We've already called AddWindowToDrawData() which called DrawList->ChannelsMerge() on DockNodeHost windows,
        // and draw list have been trimmed already, hence the explicit recreation of a draw command if missing.
        // FIXME: This is creating complication, might be simpler if we could inject a drawlist in drawdata at a given position and not attempt to manipulate ImDrawCmd order.
        ImDrawList* draw_list = window->RootWindowDockTree->DrawList;
        if (draw_list->CmdBuffer.Size == 0)
            draw_list->AddDrawCmd();
        draw_list->PushClipRect(viewport_rect.Min - ImVec2(1, 1), viewport_rect.Max + ImVec2(1, 1), false); // Ensure ImDrawCmd are not merged
        draw_list->AddRectFilled(viewport_rect.Min, viewport_rect.Max, col);
        ImDrawCmd cmd = draw_list->CmdBuffer.back();
        IM_ASSERT(cmd.ElemCount == 6);
        draw_list->CmdBuffer.pop_back();
        draw_list->CmdBuffer.push_front(cmd);
        draw_list->PopClipRect();
        draw_list->AddDrawCmd(); // We need to create a command as CmdBuffer.back().IdxOffset won't be correct if we append to same command.
    }

    // Draw over sibling docking nodes in a same docking tree
    if (window->RootWindow->DockIsActive)
    {
        ImDrawList* draw_list = FindFrontMostVisibleChildWindow(window->RootWindowDockTree)->DrawList;
        if (draw_list->CmdBuffer.Size == 0)
            draw_list->AddDrawCmd();
        draw_list->PushClipRect(viewport_rect.Min, viewport_rect.Max, false);
        RenderRectFilledWithHole(draw_list, window->RootWindowDockTree->Rect(), window->RootWindow->Rect(), col, 0.0f);// window->RootWindowDockTree->WindowRounding);
        draw_list->PopClipRect();
    }
}